

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O1

PatternGeneration * __thiscall
PatternGeneration::getFlatTexture(PatternGeneration *this,Scalar *color,int *imageSize)

{
  int *in_RCX;
  undefined4 local_48 [2];
  PatternGeneration *local_40;
  undefined8 local_38;
  _InputArray local_30;
  
  cv::Mat::Mat((Mat *)this,*in_RCX,*in_RCX,0x10,(Scalar_ *)imageSize);
  local_38 = 0;
  local_48[0] = 0x1010000;
  local_30.sz.width = 0;
  local_30.sz.height = 0;
  local_30.flags = 0x2010000;
  local_40 = this;
  local_30.obj = this;
  cv::cvtColor((cv *)local_48,&local_30,(_OutputArray *)0x39,0,(int)imageSize);
  return this;
}

Assistant:

cv::Mat PatternGeneration::getFlatTexture(const cv::Scalar & color, const int & imageSize)
{
    cv::Mat flat(imageSize,imageSize,CV_8UC3,color);
    cvtColor(flat,flat,cv::COLOR_Lab2RGB); // converting back to 8U with scaling
    return flat;
}